

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

void google::MaybeAppendWithLength(State *state,char *str,int length)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  
  if ((0 < length) && (state->append != false)) {
    bVar2 = *str;
    if (bVar2 == 0x3c) {
      pcVar1 = state->out_cur;
      if ((state->out_begin < pcVar1) && (pcVar1[-1] == '<')) {
        if (pcVar1 + 1 < state->out_end) {
          *pcVar1 = ' ';
          pcVar1 = state->out_cur;
          state->out_cur = pcVar1 + 1;
          if ((state->overflowed & 1U) == 0) {
            pcVar1[1] = '\0';
          }
        }
        else {
          state->overflowed = true;
        }
      }
      bVar2 = *str;
    }
    pcVar1 = state->out_cur;
    if ((bVar2 == 0x5f) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
      state->prev_name = pcVar1;
      state->prev_name_length = length;
    }
    uVar3 = 0;
    do {
      if (state->out_end <= pcVar1 + 1) {
        state->overflowed = true;
        return;
      }
      *pcVar1 = str[uVar3];
      pcVar1 = state->out_cur + 1;
      state->out_cur = pcVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
    if ((state->overflowed & 1U) == 0) {
      *pcVar1 = '\0';
      return;
    }
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char * const str,
                                  const int length) {
  if (state->append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && state->out_begin < state->out_cur  &&
        state->out_cur[-1] == '<') {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors.
    if (IsAlpha(str[0]) || str[0] == '_') {
      state->prev_name = state->out_cur;
      state->prev_name_length = length;
    }
    Append(state, str, length);
  }
}